

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

void __thiscall JSONValue::~JSONValue(JSONValue *this)

{
  JSONType JVar1;
  JSONString *pJVar2;
  JSONValue *this_local;
  
  JVar1 = this->type;
  if (JVar1 == String) {
    if (((this->field_1).svalue != (JSONString *)0x0) &&
       (pJVar2 = (this->field_1).svalue, pJVar2 != (JSONString *)0x0)) {
      std::__cxx11::string::~string((string *)pJVar2);
      operator_delete(pJVar2);
    }
  }
  else if (JVar1 == List) {
    if (((this->field_1).svalue != (JSONString *)0x0) &&
       (pJVar2 = (this->field_1).svalue, pJVar2 != (JSONString *)0x0)) {
      std::__cxx11::list<JSONValue,_std::allocator<JSONValue>_>::~list
                ((list<JSONValue,_std::allocator<JSONValue>_> *)pJVar2);
      operator_delete(pJVar2);
    }
  }
  else if (((JVar1 == Object) && ((this->field_1).svalue != (JSONString *)0x0)) &&
          (pJVar2 = (this->field_1).svalue, pJVar2 != (JSONString *)0x0)) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>_>_>
                      *)pJVar2);
    operator_delete(pJVar2);
  }
  return;
}

Assistant:

~JSONValue()
    {
        switch (type)
        {
        case JSONType::String:
            if (svalue != nullptr) delete svalue; break;
        case JSONType::List:
            if (lvalue != nullptr) delete lvalue; break;
        case JSONType::Object:
            if (ovalue != nullptr) delete ovalue; break;
        }
    }